

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::
emplace<QAbstractItemModelPrivate::Change_const&>
          (QMovableArrayOps<QAbstractItemModelPrivate::Change> *this,qsizetype i,Change *args)

{
  Change **ppCVar1;
  qsizetype *pqVar2;
  Change *pCVar3;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  QAbstractItemModel *pQVar13;
  int iVar14;
  int iVar15;
  undefined7 uVar16;
  quintptr qVar17;
  Change *pCVar18;
  long in_FS_OFFSET;
  bool bVar19;
  int local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
           super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004674aa:
    uVar8 = *(undefined8 *)&args->needsAdjust;
    iVar11 = (args->parent).r;
    iVar12 = (args->parent).c;
    qVar17 = (args->parent).i;
    pQVar13 = (args->parent).m.ptr;
    iVar14 = args->first;
    iVar15 = args->last;
    bVar19 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size != 0;
    QArrayDataPointer<QAbstractItemModelPrivate::Change>::detachAndGrow
              ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this,(uint)(i == 0 && bVar19)
               ,1,(Change **)0x0,(QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0);
    pCVar18 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
              super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
    uStack_50 = (undefined4)qVar17;
    uStack_4c = (undefined4)(qVar17 >> 0x20);
    local_48 = SUB84(pQVar13,0);
    uStack_44 = (undefined4)((ulong)pQVar13 >> 0x20);
    if (i != 0 || !bVar19) {
      pCVar3 = pCVar18 + i;
      memmove(pCVar3 + 1,pCVar18 + i,
              ((this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size - i) * 0x28);
      (pCVar3->parent).r = iVar11;
      (pCVar3->parent).c = iVar12;
      *(undefined4 *)&(pCVar3->parent).i = uStack_50;
      *(undefined4 *)((long)&(pCVar3->parent).i + 4) = uStack_4c;
      *(undefined4 *)&(pCVar3->parent).m.ptr = local_48;
      *(undefined4 *)((long)&(pCVar3->parent).m.ptr + 4) = uStack_44;
      pCVar3->first = iVar14;
      pCVar3->last = iVar15;
      *(undefined8 *)&pCVar3->needsAdjust = uVar8;
      goto LAB_00467558;
    }
    *(undefined8 *)&pCVar18[-1].needsAdjust = uVar8;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
            super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size;
    if ((lVar7 == i && pDVar6 != (Data *)0x0) &&
       ((pDVar6->super_QArrayData).alloc - lVar7 !=
        ((long)((long)(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
                      super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pCVar18 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
                super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
      uVar16 = *(undefined7 *)&args->field_0x21;
      pCVar18[lVar7].needsAdjust = args->needsAdjust;
      *(undefined7 *)&pCVar18[lVar7].field_0x21 = uVar16;
      iVar11 = (args->parent).r;
      iVar12 = (args->parent).c;
      qVar17 = (args->parent).i;
      uVar9 = *(undefined4 *)((long)&(args->parent).i + 4);
      uVar10 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
      iVar14 = args->first;
      iVar15 = args->last;
      ptVar4 = &pCVar18[lVar7].parent.m;
      *(undefined4 *)&ptVar4->ptr = *(undefined4 *)&(args->parent).m.ptr;
      *(undefined4 *)((long)&ptVar4->ptr + 4) = uVar10;
      *(int *)(ptVar4 + 1) = iVar14;
      *(int *)((long)(ptVar4 + 1) + 4) = iVar15;
      pCVar18 = pCVar18 + lVar7;
      (pCVar18->parent).r = iVar11;
      (pCVar18->parent).c = iVar12;
      *(int *)&(pCVar18->parent).i = (int)qVar17;
      *(undefined4 *)((long)&(pCVar18->parent).i + 4) = uVar9;
      goto LAB_00467558;
    }
    if (((i != 0) || (pDVar6 == (Data *)0x0)) ||
       ((Change *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
        super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr)) goto LAB_004674aa;
    pCVar18 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
              super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
    uVar16 = *(undefined7 *)&args->field_0x21;
    pCVar18[-1].needsAdjust = args->needsAdjust;
    *(undefined7 *)&pCVar18[-1].field_0x21 = uVar16;
    iVar11 = (args->parent).r;
    iVar12 = (args->parent).c;
    uStack_50 = (undefined4)(args->parent).i;
    uStack_4c = *(undefined4 *)((long)&(args->parent).i + 4);
    local_48 = *(undefined4 *)&(args->parent).m.ptr;
    uStack_44 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
    iVar14 = args->first;
    iVar15 = args->last;
  }
  *(undefined4 *)&pCVar18[-1].parent.m.ptr = local_48;
  *(undefined4 *)((long)&pCVar18[-1].parent.m.ptr + 4) = uStack_44;
  pCVar18[-1].first = iVar14;
  pCVar18[-1].last = iVar15;
  pCVar18[-1].parent.r = iVar11;
  pCVar18[-1].parent.c = iVar12;
  *(undefined4 *)&pCVar18[-1].parent.i = uStack_50;
  *(undefined4 *)((long)&pCVar18[-1].parent.i + 4) = uStack_4c;
  ppCVar1 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
  *ppCVar1 = *ppCVar1 + -1;
LAB_00467558:
  pqVar2 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
            super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }